

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int changeTempStorage(Parse *pParse,char *zStorageType)

{
  sqlite3 *psVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  uchar uVar10;
  uchar uVar11;
  ulong uVar5;
  
  bVar3 = *zStorageType;
  bVar9 = bVar3 - 0x30;
  if (2 < bVar9) {
    if (bVar3 == 0) {
      pbVar7 = (byte *)0x1812c8;
    }
    else {
      lVar2 = 0;
      bVar9 = bVar3;
      do {
        lVar6 = lVar2;
        uVar10 = ""[bVar9];
        uVar11 = ""[(byte)"unable to open database file"[lVar6 + 0x18]];
        if (uVar10 != uVar11) goto LAB_00171c69;
        bVar9 = zStorageType[lVar6 + 1];
        lVar2 = lVar6 + 1;
      } while (bVar9 != 0);
      uVar11 = ""[(byte)"unable to open database file"[lVar6 + 0x19]];
      uVar10 = '\0';
LAB_00171c69:
      bVar9 = 1;
      if (uVar10 == uVar11) goto LAB_00171cbc;
      pbVar8 = (byte *)(zStorageType + 1);
      pbVar7 = (byte *)0x1812c8;
      do {
        uVar5 = (ulong)bVar3;
        if (""[uVar5] != ""[*pbVar7]) goto LAB_00171ca5;
        pbVar7 = pbVar7 + 1;
        bVar3 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while (bVar3 != 0);
    }
    uVar5 = 0;
LAB_00171ca5:
    bVar9 = (""[uVar5] == ""[*pbVar7]) * '\x02';
  }
LAB_00171cbc:
  psVar1 = pParse->db;
  bVar3 = psVar1->temp_store;
  uVar4 = (uint)bVar3;
  if ((bVar9 != bVar3) && (uVar4 = invalidateTempStorage(pParse), uVar4 == 0)) {
    psVar1->temp_store = bVar9;
  }
  return uVar4;
}

Assistant:

static int changeTempStorage(Parse *pParse, const char *zStorageType){
  int ts = getTempStore(zStorageType);
  sqlite3 *db = pParse->db;
  if( db->temp_store==ts ) return SQLITE_OK;
  if( invalidateTempStorage( pParse ) != SQLITE_OK ){
    return SQLITE_ERROR;
  }
  db->temp_store = (u8)ts;
  return SQLITE_OK;
}